

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_cp_setfrompoc(jpc_dec_cp_t *cp,jpc_poc_t *poc,int reset)

{
  int iVar1;
  jpc_pchg_t *pjVar2;
  long lVar3;
  jpc_pchglist_t *pchglist;
  long lVar4;
  
  pchglist = cp->pchglist;
  while (iVar1 = jpc_pchglist_numpchgs(pchglist), 0 < iVar1) {
    pjVar2 = jpc_pchglist_remove(pchglist,0);
    jpc_pchg_destroy(pjVar2);
    pchglist = cp->pchglist;
  }
  if (0 < poc->numpchgs) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      pjVar2 = jpc_pchg_copy((jpc_pchg_t *)(&poc->pchgs->prgord + lVar4));
      if (pjVar2 == (jpc_pchg_t *)0x0) {
        return -1;
      }
      iVar1 = jpc_pchglist_insert(cp->pchglist,-1,pjVar2);
      if (iVar1 != 0) {
        return -1;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < poc->numpchgs);
  }
  return 0;
}

Assistant:

static int jpc_dec_cp_setfrompoc(jpc_dec_cp_t *cp, jpc_poc_t *poc, int reset)
{
	int pchgno;
	jpc_pchg_t *pchg;
	if (reset) {
		while (jpc_pchglist_numpchgs(cp->pchglist) > 0) {
			pchg = jpc_pchglist_remove(cp->pchglist, 0);
			jpc_pchg_destroy(pchg);
		}
	}
	for (pchgno = 0; pchgno < poc->numpchgs; ++pchgno) {
		if (!(pchg = jpc_pchg_copy(&poc->pchgs[pchgno]))) {
			return -1;
		}
		if (jpc_pchglist_insert(cp->pchglist, -1, pchg)) {
			return -1;
		}
	}
	return 0;
}